

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool intersect_skewed_uint16_nonempty(uint16_t *small,size_t size_s,uint16_t *large,size_t size_l)

{
  int32_t iVar1;
  ushort local_44;
  ushort local_42;
  uint16_t val_s;
  size_t sStack_40;
  uint16_t val_l;
  size_t idx_s;
  size_t idx_l;
  size_t size_l_local;
  uint16_t *large_local;
  size_t size_s_local;
  uint16_t *small_local;
  
  idx_s = 0;
  sStack_40 = 0;
  if (size_s != 0) {
    local_42 = *large;
    local_44 = *small;
    while( true ) {
      while (local_44 <= local_42) {
        if (local_42 <= local_44) {
          return true;
        }
        sStack_40 = sStack_40 + 1;
        if (sStack_40 == size_s) {
          return false;
        }
        local_44 = small[sStack_40];
      }
      iVar1 = advanceUntil(large,(int32_t)idx_s,(int32_t)size_l,local_44);
      idx_s = (size_t)iVar1;
      if (idx_s == size_l) break;
      local_42 = large[idx_s];
    }
  }
  return false;
}

Assistant:

bool intersect_skewed_uint16_nonempty(const uint16_t *small, size_t size_s,
                                const uint16_t *large, size_t size_l) {
    size_t idx_l = 0, idx_s = 0;

    if (0 == size_s) {
        return false;
    }

    uint16_t val_l = large[idx_l], val_s = small[idx_s];

    while (true) {
        if (val_l < val_s) {
            idx_l = advanceUntil(large, (int32_t)idx_l, (int32_t)size_l, val_s);
            if (idx_l == size_l) break;
            val_l = large[idx_l];
        } else if (val_s < val_l) {
            idx_s++;
            if (idx_s == size_s) break;
            val_s = small[idx_s];
        } else {
            return true;
        }
    }

    return false;
}